

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.h
# Opt level: O0

void anurbs::Point<2l>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  char *name_00;
  class_<anurbs::Point<2l>,std::shared_ptr<anurbs::Point<2l>>> *pcVar1;
  code *local_100;
  undefined8 local_f8;
  code *local_f0;
  undefined8 local_e8;
  code *local_e0;
  undefined8 local_d8;
  code *local_d0;
  undefined8 local_c8;
  arg local_c0;
  arg local_b0;
  arg local_a0;
  arg local_90;
  constructor<const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_79;
  arg local_78;
  arg local_68;
  constructor<const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_&> local_55 [13];
  handle local_48;
  class_<anurbs::Point<2L>,_std::shared_ptr<anurbs::Point<2L>_>_> local_40;
  string local_38 [8];
  string name;
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model_local;
  module *m_local;
  
  name.field_2._8_8_ = model;
  python_name_abi_cxx11_();
  local_48.m_ptr = (m->super_object).super_handle.m_ptr;
  name_00 = (char *)std::__cxx11::string::c_str();
  pybind11::class_<anurbs::Point<2L>,_std::shared_ptr<anurbs::Point<2L>_>_>::class_<>
            (&local_40,local_48,name_00);
  pybind11::init<Eigen::Matrix<double,1,2,1,1,2>const&>();
  local_78 = pybind11::literals::operator____a("location",8);
  local_68.name = local_78.name;
  local_68._8_1_ = local_78._8_1_;
  pcVar1 = (class_<anurbs::Point<2l>,std::shared_ptr<anurbs::Point<2l>>> *)
           pybind11::class_<anurbs::Point<2l>,std::shared_ptr<anurbs::Point<2l>>>::
           def<Eigen::Matrix<double,1,2,1,1,2>const&,pybind11::arg>
                     ((class_<anurbs::Point<2l>,std::shared_ptr<anurbs::Point<2l>>> *)&local_40,
                      local_55,&local_68);
  pybind11::init<Eigen::Matrix<double,1,2,1,1,2>const&,std::__cxx11::string_const&>();
  local_a0 = pybind11::literals::operator____a("location",8);
  local_90.name = local_a0.name;
  local_90._8_1_ = local_a0._8_1_;
  local_c0 = pybind11::literals::operator____a("text",4);
  local_b0.name = local_c0.name;
  local_b0._8_1_ = local_c0._8_1_;
  pcVar1 = (class_<anurbs::Point<2l>,std::shared_ptr<anurbs::Point<2l>>> *)
           pybind11::class_<anurbs::Point<2l>,std::shared_ptr<anurbs::Point<2l>>>::
           def<Eigen::Matrix<double,1,2,1,1,2>const&,std::__cxx11::string_const&,pybind11::arg,pybind11::arg>
                     (pcVar1,&local_79,&local_90,&local_b0);
  local_d0 = Point<2L>::location;
  local_c8 = 0;
  local_e0 = Point<2L>::set_location;
  local_d8 = 0;
  pcVar1 = (class_<anurbs::Point<2l>,std::shared_ptr<anurbs::Point<2l>>> *)
           pybind11::class_<anurbs::Point<2l>,std::shared_ptr<anurbs::Point<2l>>>::
           def_property<Eigen::Matrix<double,1,2,1,1,2>(anurbs::Point<2l>::*)()const,void(anurbs::Point<2l>::*)(Eigen::Matrix<double,1,2,1,1,2>const&)>
                     (pcVar1,"location",(offset_in_Model_to_subr *)&local_d0,
                      (offset_in_Model_to_subr *)&local_e0);
  local_f0 = text_abi_cxx11_;
  local_e8 = 0;
  local_100 = Point<2L>::set_text;
  local_f8 = 0;
  pybind11::class_<anurbs::Point<2l>,std::shared_ptr<anurbs::Point<2l>>>::
  def_property<std::__cxx11::string(anurbs::Point<2l>::*)()const,void(anurbs::Point<2l>::*)(std::__cxx11::string_const&)>
            (pcVar1,"text",(offset_in_Model_to_subr *)&local_f0,
             (offset_in_Model_to_subr *)&local_100);
  pybind11::class_<anurbs::Point<2L>,_std::shared_ptr<anurbs::Point<2L>_>_>::~class_(&local_40);
  Model::register_python_data_type<anurbs::Point<2l>>
            (m,(class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *)name.field_2._8_8_);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = Point<TDimension>;
        using Holder = anurbs::Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Holder>(m, name.c_str())
            // constructors
            .def(py::init<const Vector&>(), "location"_a)
            .def(py::init<const Vector&, const std::string&>(), "location"_a,
                "text"_a)
            // properties
            .def_property("location", &Type::location, &Type::set_location)
            .def_property("text", &Type::text, &Type::set_text)
        ;

        Model::register_python_data_type<Type>(m, model);
    }